

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniformxx.hpp
# Opt level: O0

ret_t_conflict
trng::utility::u01xx_traits<double,_1UL,_generator_min<trng::yarn5s>_>::variate
          (generator_min<trng::yarn5s> *r)

{
  ret_t_conflict rVar1;
  size_t i;
  ret_t_conflict ret;
  ret_t_conflict scale_per_step;
  generator_min<trng::yarn5s> *in_stack_ffffffffffffffe0;
  long lVar2;
  undefined8 local_18;
  
  local_18 = addin(in_stack_ffffffffffffffe0);
  for (lVar2 = 1; lVar2 == 0; lVar2 = lVar2 + 1) {
    rVar1 = addin((generator_min<trng::yarn5s> *)0x0);
    local_18 = local_18 * 2147461007.0 + rVar1;
  }
  return local_18;
}

Assistant:

TRNG_CUDA_ENABLE
      static ret_t variate(prng_t &r) {
        static_assert(prng_t::min() >= 0 and prng_t::max() > prng_t::min(),
                      "min max out of range");  // min and/or max out of spec?
        static_assert(prng_t::max() - prng_t::min() <= ~0ull,
                      "min max have exotic values/types");  // Bits, Holes incorrect otherwise
        static_assert(not math::numeric_limits<return_type>::is_integer, "not an integer");
        static_assert(calls_needed > 0 and calls_needed <= bits, "illegal number of calls");
        const ret_t scale_per_step(ret_t(domain_max) + 1);
        ret_t ret{addin(r)};
        for (std::size_t i{1}; i < calls_needed; ++i)
          ret = ret * scale_per_step + addin(r);
        return ret;
      }